

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O0

newtRef NewtExpandPath(char *s)

{
  char sep_00;
  char *pcStack_30;
  char sep;
  char *wd;
  char *dir;
  char *subdir;
  newtRefVar r;
  char *s_local;
  
  subdir = (char *)0xfff2;
  dir = (char *)0x0;
  wd = (char *)0x0;
  pcStack_30 = (char *)0x0;
  r = (newtRefVar)s;
  sep_00 = NewtGetFileSeparator();
  if (*(char *)r == sep_00) {
    wd = (char *)r;
  }
  else if (*(char *)r == '~') {
    wd = NewtGetHomeDir((char *)r,&dir);
    if ((dir == (char *)0x0) || (dir[1] == '\0')) {
      dir = (char *)0x0;
    }
    else {
      dir = dir + 1;
    }
  }
  else {
    dir = (char *)r;
  }
  if (wd == (char *)0x0) {
    pcStack_30 = getcwd((char *)0x0,0);
    wd = pcStack_30;
  }
  if (dir != (char *)0x0) {
    wd = NewtJoinPath(wd,dir,sep_00);
    NewtRelToAbsPath(wd);
  }
  subdir = (char *)NewtMakeString(wd,false);
  if (dir != (char *)0x0) {
    free(wd);
  }
  if (pcStack_30 != (char *)0x0) {
    free(pcStack_30);
  }
  return (newtRef)subdir;
}

Assistant:

newtRef NewtExpandPath(const char *	s)
{
    newtRefVar	r = kNewtRefUnbind;
    char *  subdir = NULL;
    char *  dir = NULL;
    char *  wd = NULL;
    char	sep;
    
    sep = NewtGetFileSeparator();
    
    if (*s == sep)
    {
        dir = (char *)s;
    }
#ifdef WIN32
    else if (isalpha(*s) && s[1] == ':')
    {
        dir = (char *)s;
    }
#endif
    else if (*s == '~')
    {
        dir = NewtGetHomeDir(s, &subdir);
        
        if (subdir != NULL && subdir[1])
            subdir++;
        else
            subdir = NULL;
    }
    else
    {
        subdir = (char *)s;
    }